

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::CLUFactor<double>::eliminateNucleus(CLUFactor<double> *this,double eps,double threshold)

{
  Pring *pPVar1;
  int *piVar2;
  int iVar3;
  int p_col;
  Pring *pPVar4;
  
  if (this->stat != SINGULAR) {
    pPVar1 = &(this->temp).pivots;
    (this->temp).pivots.mkwtz = -1;
    (this->temp).pivots.idx = -1;
    (this->temp).pivots.pos = -1;
    do {
      iVar3 = (this->temp).stage;
      if (this->thedim + -1 <= iVar3) {
        if (this->thedim <= iVar3) {
          return;
        }
        iVar3 = ((this->temp).pivot_rowNZ[1].next)->idx;
        p_col = ((this->temp).pivot_colNZ[1].next)->idx;
        (this->u).row.len[iVar3] = 0;
        piVar2 = (this->u).col.len + p_col;
        *piVar2 = *piVar2 + -1;
        setPivot(this,(this->temp).stage,p_col,iVar3,
                 (this->u).row.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[(this->u).row.start[iVar3]]);
        return;
      }
      pPVar4 = (this->temp).pivot_rowNZ;
      if (pPVar4[1].next == pPVar4 + 1) {
        pPVar4 = (this->temp).pivot_colNZ;
        if (pPVar4[1].next == pPVar4 + 1) {
          (this->temp).pivots.next = pPVar1;
          (this->temp).pivots.prev = pPVar1;
          selectPivots(this,threshold);
          for (pPVar4 = (this->temp).pivots.next; pPVar4 != pPVar1; pPVar4 = pPVar4->next) {
            eliminatePivot(this,pPVar4->idx,pPVar4->pos,eps);
          }
        }
        else {
          eliminateColSingletons(this);
        }
      }
      else {
        eliminateRowSingletons(this);
      }
      pPVar4 = (this->temp).pivot_rowNZ;
    } while ((pPVar4->next == pPVar4) && (pPVar4 = (this->temp).pivot_colNZ, pPVar4->next == pPVar4)
            );
    this->stat = SINGULAR;
  }
  return;
}

Assistant:

void CLUFactor<R>::eliminateNucleus(const R eps,
                                    const R threshold)
{
   int r, c;
   CLUFactor<R>::Pring* pivot;

   if(this->stat == SLinSolver<R>::SINGULAR)
      return;

   temp.pivots.mkwtz = -1;

   temp.pivots.idx = -1;

   temp.pivots.pos = -1;

   while(temp.stage < thedim - 1)
   {
#ifndef NDEBUG
      int i;
      // CLUFactorIsConsistent(fac);

      for(i = 0; i < thedim; ++i)
         if(col.perm[i] < 0)
            assert(temp.s_mark[i] == 0);

#endif

      if(temp.pivot_rowNZ[1].next != &(temp.pivot_rowNZ[1]))
         /* row singleton available */
         eliminateRowSingletons();
      else if(temp.pivot_colNZ[1].next != &(temp.pivot_colNZ[1]))
         /* column singleton available */
         eliminateColSingletons();
      else
      {
         initDR(temp.pivots);
         selectPivots(threshold);

         assert(temp.pivots.next != &temp.pivots &&
                "ERROR: no pivot element selected");

         for(pivot = temp.pivots.next; pivot != &temp.pivots;
               pivot = pivot->next)
         {
            eliminatePivot(pivot->idx, pivot->pos, eps);
         }
      }

      if(temp.pivot_rowNZ->next != temp.pivot_rowNZ ||
            temp.pivot_colNZ->next != temp.pivot_colNZ)
      {
         this->stat = SLinSolver<R>::SINGULAR;
         return;
      }
   }

   if(temp.stage < thedim)
   {
      /*      Eliminate remaining element.
       *      Note, that this must be both, column and row singleton.
       */
      assert(temp.pivot_rowNZ[1].next != &(temp.pivot_rowNZ[1]) &&
             "ERROR: one row must be left");
      assert(temp.pivot_colNZ[1].next != &(temp.pivot_colNZ[1]) &&
             "ERROR: one col must be left");
      r = temp.pivot_rowNZ[1].next->idx;
      c = temp.pivot_colNZ[1].next->idx;
      u.row.len[r] = 0;
      u.col.len[c]--;
      setPivot(temp.stage, c, r, u.row.val[u.row.start[r]]);
   }
}